

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateFile(HtmlparserCppTest *this,string *filename)

{
  HtmlParser *this_00;
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  string annotation_block;
  string fullpath;
  string dir;
  string buffer;
  char buffer_1 [8092];
  
  pcVar2 = getenv("TEMPLATE_ROOTDIR");
  pcVar7 = ".";
  if (pcVar2 != (char *)0x0) {
    pcVar7 = pcVar2;
  }
  std::__cxx11::string::string((string *)buffer_1,pcVar7,(allocator *)&fullpath);
  std::__cxx11::string::string((string *)&annotation_block,"src",(allocator *)&buffer);
  ctemplate::PathJoin((string *)&dir,(string *)buffer_1);
  std::__cxx11::string::~string((string *)&annotation_block);
  std::__cxx11::string::~string((string *)buffer_1);
  std::__cxx11::string::string((string *)&annotation_block,"tests",(allocator *)&fullpath);
  ctemplate::PathJoin((string *)buffer_1,(string *)&dir);
  std::__cxx11::string::operator=((string *)&dir,(string *)buffer_1);
  std::__cxx11::string::~string((string *)buffer_1);
  std::__cxx11::string::~string((string *)&annotation_block);
  std::__cxx11::string::string
            ((string *)&annotation_block,"htmlparser_testdata",(allocator *)&fullpath);
  ctemplate::PathJoin((string *)buffer_1,(string *)&dir);
  std::__cxx11::string::operator=((string *)&dir,(string *)buffer_1);
  std::__cxx11::string::~string((string *)buffer_1);
  std::__cxx11::string::~string((string *)&annotation_block);
  ctemplate::PathJoin((string *)&fullpath,(string *)&dir);
  fprintf(_stderr,"Validating %s",fullpath._M_dataplus._M_p);
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  __stream = fopen(fullpath._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
LAB_00108777:
    perror(fullpath._M_dataplus._M_p);
  }
  else {
    while (sVar3 = fread(buffer_1,1,0x1f9c,__stream), sVar3 != 0) {
      iVar1 = ferror(__stream);
      if (iVar1 != 0) goto LAB_00108777;
      annotation_block._M_dataplus._M_p = (pointer)&annotation_block.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&annotation_block,buffer_1,buffer_1 + sVar3);
      std::__cxx11::string::append((string *)&buffer);
      std::__cxx11::string::~string((string *)&annotation_block);
    }
    fclose(__stream);
    uVar6 = 0;
    lVar4 = std::__cxx11::string::find((char *)&buffer,0x10a020);
    lVar5 = std::__cxx11::string::find((char *)&buffer,0x10a028);
    this_00 = &this->parser_;
    while( true ) {
      if (lVar4 == -1) {
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::string::~string((string *)&fullpath);
        std::__cxx11::string::~string((string *)&dir);
        return;
      }
      std::__cxx11::string::string((string *)buffer_1,(string *)&buffer,uVar6,lVar4 - uVar6);
      HtmlParser::Parse(this_00,(string *)buffer_1);
      std::__cxx11::string::string
                ((string *)&annotation_block,(string *)&buffer,lVar4 + 7U,lVar5 - (lVar4 + 7U));
      ProcessAnnotation(this,&annotation_block);
      iVar1 = HtmlParser::line_number(this_00);
      iVar1 = UpdateLines(&annotation_block,iVar1);
      HtmlParser::set_line_number(this_00,iVar1);
      iVar1 = HtmlParser::column_number(this_00);
      iVar1 = UpdateColumns(&annotation_block,iVar1);
      HtmlParser::set_column_number(this_00,iVar1);
      uVar6 = lVar5 + 2;
      lVar4 = std::__cxx11::string::find((char *)&buffer,0x10a020);
      lVar5 = std::__cxx11::string::find((char *)&buffer,0x10a028);
      if (lVar5 == -1 && lVar4 != -1) break;
      std::__cxx11::string::~string((string *)&annotation_block);
      std::__cxx11::string::~string((string *)buffer_1);
    }
    fprintf(_stderr,"Check failed: %s\n",
            "!(start_annotation != string::npos && end_annotation == string::npos)");
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateFile(string filename) {
  // If TEMPLATE_ROOTDIR is set in the environment, it overrides the
  // default of ".".  We use an env-var rather than argv because
  // that's what automake supports most easily.
  const char* template_rootdir = getenv("TEMPLATE_ROOTDIR");
  if (template_rootdir == NULL)
    template_rootdir = DEFAULT_TEMPLATE_ROOTDIR;   // probably "."
  string dir = PathJoin(template_rootdir, "src");
  dir = PathJoin(dir, "tests");
  dir = PathJoin(dir, "htmlparser_testdata");
  const string fullpath = PathJoin(dir, filename);
  fprintf(stderr, "Validating %s", fullpath.c_str());
  string buffer;
  ReadToString(fullpath.c_str(), &buffer);

  // Start of the current html block.
  size_t start_html = 0;

  // Start of the next annotation.
  size_t start_annotation = buffer.find(kDirectiveBegin, 0);

  // Ending of the current annotation.
  size_t end_annotation = buffer.find(kDirectiveEnd, start_annotation);

  while (start_annotation != string::npos) {
    string html_block(buffer, start_html, start_annotation - start_html);
    parser_.Parse(html_block);

    start_annotation += strlen(kDirectiveBegin);

    string annotation_block(buffer, start_annotation,
                            end_annotation - start_annotation);
    ProcessAnnotation(annotation_block);

    // Update line and column count.
    parser_.set_line_number(UpdateLines(annotation_block,
                                        parser_.line_number()));
    parser_.set_column_number(UpdateColumns(annotation_block,
                                            parser_.column_number()));

    start_html = end_annotation + strlen(kDirectiveEnd);
    start_annotation = buffer.find(kDirectiveBegin, start_html);
    end_annotation = buffer.find(kDirectiveEnd, start_annotation);

    // Check for unclosed annotation.
    CHECK(!(start_annotation != string::npos &&
            end_annotation == string::npos));
  }
}